

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

unsigned_long
AdaptingOutputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  void ***pppvVar1;
  uint uVar2;
  void **ppvVar3;
  PaStreamCallbackTimeInfo *pPVar4;
  int iVar5;
  void ***pppvVar6;
  uint uVar7;
  uint uVar8;
  unsigned_long uVar9;
  PaUtilChannelDescriptor *pPVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  undefined1 auVar17 [16];
  
  pppvVar1 = &bp->tempOutputBufferPtrs;
  uVar13 = 0;
  do {
    uVar14 = bp->framesInTempOutputBuffer;
    uVar11 = framesToProcess;
    if (uVar14 == 0) {
      if (*streamCallbackResult == 0) {
        if (bp->userOutputIsInterleaved == 0) {
          uVar2 = bp->outputChannelCount;
          uVar9 = bp->framesPerUserBuffer;
          pppvVar6 = pppvVar1;
          if ((ulong)uVar2 != 0) {
            uVar8 = bp->bytesPerUserOutputSample;
            lVar15 = 0;
            uVar14 = 0;
            do {
              (*pppvVar1)[uVar14] = (void *)((long)bp->tempOutputBuffer + lVar15);
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + uVar8 * uVar9;
            } while (uVar2 != uVar14);
          }
        }
        else {
          uVar9 = bp->framesPerUserBuffer;
          pppvVar6 = (void ***)&bp->tempOutputBuffer;
        }
        ppvVar3 = *pppvVar6;
        pPVar4 = bp->timeInfo;
        pPVar4->inputBufferAdcTime = 0.0;
        iVar5 = (*bp->streamCallback)
                          ((void *)0x0,ppvVar3,uVar9,pPVar4,bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar5;
        if (iVar5 == 2) {
          uVar14 = bp->framesInTempOutputBuffer;
        }
        else {
          uVar14 = bp->framesPerUserBuffer;
          auVar17._8_4_ = (int)(uVar14 >> 0x20);
          auVar17._0_8_ = uVar14;
          auVar17._12_4_ = 0x45300000;
          bp->timeInfo->outputBufferDacTime =
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0)) * bp->samplePeriod +
               bp->timeInfo->outputBufferDacTime;
          bp->framesInTempOutputBuffer = uVar14;
        }
        if (uVar14 != 0) goto LAB_001131f1;
      }
      if (bp->outputChannelCount != 0) {
        uVar14 = 0;
        pPVar10 = hostOutputChannels;
        do {
          (*bp->outputZeroer)(pPVar10->data,pPVar10->stride,(uint)framesToProcess);
          pPVar10->data =
               (void *)((long)pPVar10->data +
                       (ulong)bp->bytesPerHostOutputSample * pPVar10->stride * framesToProcess);
          uVar14 = uVar14 + 1;
          pPVar10 = pPVar10 + 1;
        } while (uVar14 < bp->outputChannelCount);
      }
    }
    else {
LAB_001131f1:
      if (uVar14 < framesToProcess) {
        uVar11 = uVar14;
      }
      uVar2 = bp->bytesPerUserOutputSample;
      uVar12 = (ulong)uVar2;
      if (bp->userOutputIsInterleaved == 0) {
        lVar15 = (bp->framesPerUserBuffer - uVar14) * uVar12;
        uVar8 = bp->outputChannelCount;
        uVar7 = 1;
        uVar12 = (ulong)((int)bp->framesPerUserBuffer * uVar2);
      }
      else {
        uVar8 = bp->outputChannelCount;
        lVar15 = (bp->framesPerUserBuffer - uVar14) * (ulong)(uVar8 * uVar2);
        uVar7 = uVar8;
      }
      if (uVar8 != 0) {
        pvVar16 = (void *)(lVar15 + (long)bp->tempOutputBuffer);
        uVar14 = 0;
        pPVar10 = hostOutputChannels;
        do {
          (*bp->outputConverter)
                    (pPVar10->data,pPVar10->stride,pvVar16,uVar7,(uint)uVar11,&bp->ditherGenerator);
          pvVar16 = (void *)((long)pvVar16 + uVar12);
          pPVar10->data =
               (void *)((long)pPVar10->data +
                       (ulong)bp->bytesPerHostOutputSample * pPVar10->stride * uVar11);
          uVar14 = uVar14 + 1;
          pPVar10 = pPVar10 + 1;
        } while (uVar14 < bp->outputChannelCount);
        uVar14 = bp->framesInTempOutputBuffer;
      }
      bp->framesInTempOutputBuffer = uVar14 - uVar11;
    }
    uVar13 = uVar13 + uVar11;
    framesToProcess = framesToProcess - uVar11;
    if (framesToProcess == 0) {
      return uVar13;
    }
  } while( true );
}

Assistant:

static unsigned long AdaptingOutputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes;  /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;

    do
    {
        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult == paContinue )
        {
            userInput = 0;

            /* setup userOutput */
            if( bp->userOutputIsInterleaved )
            {
                userOutput = bp->tempOutputBuffer;
            }
            else /* user output is not interleaved */
            {
                for( i = 0; i < bp->outputChannelCount; ++i )
                {
                    bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                            i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                }

                userOutput = bp->tempOutputBufferPtrs;
            }

            bp->timeInfo->inputBufferAdcTime = 0;
            
            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    bp->framesPerUserBuffer, bp->timeInfo,
                    bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* if the callback returned paAbort, we disregard its output */
            }
            else
            {
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
        }

        if( bp->framesInTempOutputBuffer > 0 )
        {
            /* convert frameCount frames from user buffer to host buffer */

            frameCount = PA_MIN_( bp->framesInTempOutputBuffer, framesToGo );

            if( bp->userOutputIsInterleaved )
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample * bp->outputChannelCount *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = bp->outputChannelCount;
                srcChannelStrideBytes = bp->bytesPerUserOutputSample;
            }
            else /* user output is not interleaved */
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);
                            
                srcSampleStrideSamples = 1;
                srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
            }

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputConverter(    hostOutputChannels[i].data,
                                        hostOutputChannels[i].stride,
                                        srcBytePtr, srcSampleStrideSamples,
                                        frameCount, &bp->ditherGenerator );

                srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }

            bp->framesInTempOutputBuffer -= frameCount;
        }
        else
        {
            /* no more user data is available because the callback has returned
                paComplete or paAbort. Fill the remainder of the host buffer
                with zeros.
            */

            frameCount = framesToGo;

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }
        
        framesProcessed += frameCount;
        
        framesToGo -= frameCount;

    }while( framesToGo > 0 );

    return framesProcessed;
}